

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

t_object *
xemmai::t_type_of<xemmai::t_string>::f__construct(t_type *a_class,wchar_t *a_p,size_t a_n)

{
  t_heap<xemmai::t_object> *this;
  ulong a_size;
  long lVar1;
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  long *plVar2;
  t_object *ptVar3;
  undefined8 *puVar4;
  t_object *ptVar5;
  unsigned_long __n2;
  char *__dest;
  
  plVar2 = (long *)__tls_get_addr(&PTR_0011ed08);
  lVar1 = *plVar2;
  this = (t_heap<xemmai::t_object> *)(lVar1 + 0x30);
  a_size = a_n * 4 + 0x54;
  if (a_size < 0x81) {
    plVar2 = (long *)__tls_get_addr(&PTR_0011ede0);
    ptVar5 = (t_object *)*plVar2;
    if (ptVar5 == (t_object *)0x0) {
      ptVar5 = t_heap<xemmai::t_object>::t_of<0UL,_65536UL>::f_allocate
                         ((t_of<0UL,_65536UL> *)(lVar1 + 0x90),this);
      ptVar3 = ptVar5->v_next;
    }
    else {
      ptVar3 = ptVar5->v_next;
    }
    *plVar2 = (long)ptVar3;
  }
  else {
    ptVar5 = t_heap<xemmai::t_object>::f_allocate_medium(this,a_size);
  }
  ptVar5->v_next = (t_object *)0x0;
  puVar4 = (undefined8 *)__tls_get_addr(&PTR_0011ece0);
  this_00 = (t_queue<128UL> *)*puVar4;
  *this_00->v_head = (t_object *)&a_class[-1].f_less;
  if (this_00->v_head == this_00->v_next) {
    t_slot::t_queue<128UL>::f_next(this_00);
  }
  else {
    this_00->v_head = this_00->v_head + 1;
  }
  ptVar5->v_type = a_class;
  puVar4 = (undefined8 *)__tls_get_addr(&PTR_0011ed30);
  this_01 = (t_queue<256UL> *)*puVar4;
  *this_01->v_head = ptVar5;
  if (this_01->v_head == this_01->v_next) {
    t_slot::t_queue<256UL>::f_next(this_01);
  }
  else {
    this_01->v_head = this_01->v_head + 1;
  }
  *(size_t *)ptVar5->v_data = a_n;
  __dest = ptVar5->v_data + 8;
  if (a_n != 0) {
    memmove(__dest,a_p,a_n * 4);
    __dest = __dest + a_n * 4;
  }
  __dest[0] = '\0';
  __dest[1] = '\0';
  __dest[2] = '\0';
  __dest[3] = '\0';
  return ptVar5;
}

Assistant:

static t_object* f__construct(t_type* a_class, const wchar_t* a_p, size_t a_n)
	{
		auto object = f__construct(a_class, a_n);
		*std::copy_n(a_p, a_n, (new(object->f_data()) t_string(a_n))->f_entries()) = L'\0';
		return object;
	}